

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_hex_to_byte_array(char *h,uint8_t *dest,int max)

{
  char cVar1;
  byte bVar2;
  uint8_t *puVar3;
  bool bVar4;
  int t1;
  int t;
  uint8_t *odest;
  byte *pbStack_20;
  int max_local;
  uint8_t *dest_local;
  char *h_local;
  
  odest._4_4_ = max;
  pbStack_20 = dest;
  dest_local = (uint8_t *)h;
  while( true ) {
    bVar4 = false;
    if (odest._4_4_ != 0) {
      bVar4 = *dest_local != '\0';
    }
    if (!bVar4) break;
    puVar3 = dest_local + 1;
    cVar1 = char_to_hex(*dest_local);
    if ((*puVar3 == '\0') || (cVar1 < 0)) {
      return -1;
    }
    dest_local = dest_local + 2;
    bVar2 = char_to_hex(*puVar3);
    if ((char)bVar2 < '\0') {
      return -1;
    }
    *pbStack_20 = (byte)((int)cVar1 << 4) | bVar2;
    odest._4_4_ = odest._4_4_ + -1;
    pbStack_20 = pbStack_20 + 1;
  }
  if (odest._4_4_ + -1 < 0) {
    return -1;
  }
  return (int)pbStack_20 - (int)dest;
}

Assistant:

int
lws_hex_to_byte_array(const char *h, uint8_t *dest, int max)
{
	uint8_t *odest = dest;

	while (max-- && *h) {
		int t = char_to_hex(*h++), t1;

		if (!*h || t < 0)
			return -1;

		t1 = char_to_hex(*h++);
		if (t1 < 0)
			return -1;

		*dest++ = (t << 4) | t1;
	}

	if (max < 0)
		return -1;

	return lws_ptr_diff(dest, odest);
}